

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O3

string * getEnvironmentVariable(string *__return_storage_ptr__,string *name)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  string *__s;
  undefined4 extraout_var;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __s = (string *)getenv((char *)name);
  if (__s != (string *)0x0) {
    strlen((char *)__s);
    __s = (string *)
          std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)__s);
    sVar1 = __return_storage_ptr__->_M_string_length;
    if (sVar1 != 0) {
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      sVar4 = 0;
      do {
        iVar3 = tolower((int)pcVar2[sVar4]);
        __s = (string *)CONCAT44(extraout_var,iVar3);
        pcVar2[sVar4] = (char)iVar3;
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
  }
  return __s;
}

Assistant:

static std::string getEnvironmentVariable(const std::string& name) {
    std::string result;
    const char* value = std::getenv(name.c_str());
    if (value) {
        result = value;
    }
    std::transform(result.begin(), result.end(), result.begin(), ::tolower);
    return result;
}